

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidy.c
# Opt level: O1

int main(int argc,char **argv)

{
  char cVar1;
  bool bVar2;
  FILE *__stream;
  Bool BVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  TidyDoc tdoc;
  ctmbstr ptVar8;
  char *pcVar9;
  ulong uVar10;
  ctmbstr ptVar11;
  int iVar12;
  TidyOptionId TVar13;
  FILE *__stream_00;
  TidyDoc tdoc_00;
  TidyDoc p_Var14;
  char **ppcVar15;
  int iVar16;
  uint acclvl;
  uint wraplen;
  TidyDoc local_58;
  char *local_48;
  uint local_40;
  uint local_3c;
  TidyDoc local_38;
  
  local_38 = (TidyDoc)*argv;
  tdoc = tidyCreate();
  tidySetMessageCallback(tdoc,reportCallback);
  errout = _stderr;
  BVar3 = tidyFileExists(tdoc,"/etc/tidy.conf");
  if ((BVar3 != no) &&
     (uVar4 = tidyLoadConfig(tdoc,"/etc/tidy.conf"), __stream = errout, uVar4 != 0)) {
    ptVar8 = tidyLocalizedString(0x310);
    fprintf((FILE *)__stream,ptVar8,"/etc/tidy.conf",(ulong)uVar4);
    fputc(10,(FILE *)errout);
  }
  pcVar9 = getenv("HTML_TIDY");
  if (pcVar9 == (char *)0x0) {
    BVar3 = tidyFileExists(tdoc,"~/.tidyrc");
    if ((BVar3 == no) ||
       (uVar4 = tidyLoadConfig(tdoc,"~/.tidyrc"), __stream_00 = (FILE *)errout, uVar4 == 0))
    goto LAB_00130707;
    ptVar8 = tidyLocalizedString(0x310);
    pcVar9 = "~/.tidyrc";
  }
  else {
    uVar4 = tidyLoadConfig(tdoc,pcVar9);
    __stream_00 = (FILE *)errout;
    if (uVar4 == 0) goto LAB_00130707;
    ptVar8 = tidyLocalizedString(0x310);
  }
  fprintf(__stream_00,ptVar8,pcVar9,(ulong)uVar4);
  fputc(10,(FILE *)errout);
LAB_00130707:
  iVar12 = 0;
  iVar16 = 0;
  local_48 = (char *)0x0;
LAB_00130715:
  if (argc < 1) {
LAB_00131340:
    if ((iVar12 == 0 && errout == _stderr) && (BVar3 = tidyOptGetBool(tdoc,TidyQuiet), BVar3 == no))
    {
      fputc(10,(FILE *)errout);
    }
    if (iVar12 + iVar16 != 0) {
      tidyErrorSummary(tdoc);
    }
    tidyGeneralInfo(tdoc);
    tidyRelease(tdoc);
    if (iVar12 != 0) {
      return 2;
    }
    return (uint)(iVar16 != 0);
  }
  do {
    ppcVar15 = argv + 1;
    if (argc < 2) {
      uVar4 = tidyParseStdin(tdoc);
      pcVar9 = "stdin";
    }
    else {
      pcVar9 = *ppcVar15;
      if (*pcVar9 == '-') break;
      BVar3 = tidyOptGetBool(tdoc,TidyShowFilename);
      if (BVar3 != no) {
        fprintf((FILE *)errout,"Tidy: \'%s\'",pcVar9);
        fputc(10,(FILE *)errout);
      }
      BVar3 = tidyOptGetBool(tdoc,TidyEmacs);
      if ((BVar3 != no) || (BVar3 = tidyOptGetBool(tdoc,TidyShowFilename), BVar3 != no)) {
        tidySetEmacsFile(tdoc,pcVar9);
      }
      uVar4 = tidyParseFile(tdoc,pcVar9);
    }
    if (-1 < (int)uVar4) {
      uVar4 = tidyCleanAndRepair(tdoc);
    }
    if (-1 < (int)uVar4) {
      uVar4 = tidyRunDiagnostics(tdoc);
    }
    if (1 < (int)uVar4) {
      BVar3 = tidyOptGetBool(tdoc,TidyForceOutput);
      uVar4 = uVar4 | -(uint)(BVar3 == no);
    }
    if ((-1 < (int)uVar4) && (BVar3 = tidyOptGetBool(tdoc,TidyShowMarkup), BVar3 != no)) {
      BVar3 = tidyOptGetBool(tdoc,TidyWriteBack);
      if (((argc < 2) || (BVar3 == no)) &&
         (pcVar9 = tidyOptGetValue(tdoc,TidyOutFile), pcVar9 == (ctmbstr)0x0)) {
        tidySaveStdout(tdoc);
      }
      else {
        tidySaveFile(tdoc,pcVar9);
      }
    }
    uVar5 = tidyErrorCount(tdoc);
    iVar12 = iVar12 + uVar5;
    uVar5 = tidyWarningCount(tdoc);
    iVar16 = iVar16 + uVar5;
    tidyAccessWarningCount(tdoc);
    bVar2 = argc < 3;
    argc = argc + -1;
    argv = ppcVar15;
    if (bVar2) goto LAB_00131340;
  } while( true );
  local_58 = (TidyDoc)(pcVar9 + 1);
  iVar6 = strcasecmp((char *)local_58,"xml");
  iVar7 = argc;
  if (iVar6 == 0) {
    TVar13 = TidyXmlTags;
LAB_00130c1f:
    BVar3 = yes;
LAB_00130c24:
    tidyOptSetBool(tdoc,TVar13,BVar3);
  }
  else {
    iVar6 = strcasecmp((char *)local_58,"asxml");
    if ((iVar6 == 0) || (iVar6 = strcasecmp((char *)local_58,"asxhtml"), iVar6 == 0)) {
      TVar13 = TidyXhtmlOut;
      goto LAB_00130c1f;
    }
    iVar6 = strcasecmp((char *)local_58,"ashtml");
    if (iVar6 == 0) {
      TVar13 = TidyHtmlOut;
      goto LAB_00130c1f;
    }
    iVar6 = strcasecmp((char *)local_58,"indent");
    if (iVar6 == 0) {
      tidyOptSetInt(tdoc,TidyIndentContent,2);
      uVar10 = tidyOptGetInt(tdoc,TidyIndentSpaces);
      if (uVar10 == 0) {
        tidyOptResetToDefault(tdoc,TidyIndentSpaces);
      }
      goto LAB_00130c36;
    }
    iVar6 = strcasecmp((char *)local_58,"omit");
    if (iVar6 == 0) {
      TVar13 = TidyOmitOptionalTags;
      goto LAB_00130c1f;
    }
    iVar6 = strcasecmp((char *)local_58,"upper");
    if (iVar6 == 0) {
      TVar13 = TidyUpperCaseTags;
      goto LAB_00130c1f;
    }
    iVar6 = strcasecmp((char *)local_58,"clean");
    if (iVar6 == 0) {
      TVar13 = TidyMakeClean;
      goto LAB_00130c1f;
    }
    iVar6 = strcasecmp((char *)local_58,"gdoc");
    if (iVar6 == 0) {
      TVar13 = TidyGDocClean;
      goto LAB_00130c1f;
    }
    iVar6 = strcasecmp((char *)local_58,"bare");
    if (iVar6 == 0) {
      TVar13 = TidyMakeBare;
      goto LAB_00130c1f;
    }
    iVar6 = strcasecmp((char *)local_58,"raw");
    if (((((((iVar6 == 0) || (iVar6 = strcasecmp((char *)local_58,"ascii"), iVar6 == 0)) ||
           (iVar6 = strcasecmp((char *)local_58,"latin0"), iVar6 == 0)) ||
          ((iVar6 = strcasecmp((char *)local_58,"latin1"), iVar6 == 0 ||
           (iVar6 = strcasecmp((char *)local_58,"utf8"), iVar6 == 0)))) ||
         (iVar6 = strcasecmp((char *)local_58,"iso2022"), iVar6 == 0)) ||
        (((iVar6 = strcasecmp((char *)local_58,"utf16le"), iVar6 == 0 ||
          (iVar6 = strcasecmp((char *)local_58,"utf16be"), iVar6 == 0)) ||
         ((iVar6 = strcasecmp((char *)local_58,"utf16"), iVar6 == 0 ||
          (((iVar6 = strcasecmp((char *)local_58,"shiftjis"), iVar6 == 0 ||
            (iVar6 = strcasecmp((char *)local_58,"big5"), iVar6 == 0)) ||
           (iVar6 = strcasecmp((char *)local_58,"mac"), iVar6 == 0)))))))) ||
       ((iVar6 = strcasecmp((char *)local_58,"win1252"), iVar6 == 0 ||
        (iVar6 = strcasecmp((char *)local_58,"ibm858"), iVar6 == 0)))) {
      tidySetCharEncoding(tdoc,(ctmbstr)local_58);
      goto LAB_00130c36;
    }
    iVar6 = strcasecmp((char *)local_58,"numeric");
    if (iVar6 == 0) {
      TVar13 = TidyNumEntities;
      goto LAB_00130c1f;
    }
    iVar6 = strcasecmp((char *)local_58,"modify");
    if (((iVar6 == 0) || (iVar6 = strcasecmp((char *)local_58,"change"), iVar6 == 0)) ||
       (iVar6 = strcasecmp((char *)local_58,"update"), iVar6 == 0)) {
      TVar13 = TidyWriteBack;
      goto LAB_00130c1f;
    }
    iVar6 = strcasecmp((char *)local_58,"errors");
    if (iVar6 == 0) {
      TVar13 = TidyShowMarkup;
      BVar3 = no;
      goto LAB_00130c24;
    }
    iVar6 = strcasecmp((char *)local_58,"quiet");
    if (iVar6 == 0) {
      TVar13 = TidyQuiet;
      goto LAB_00130c1f;
    }
    iVar6 = strcasecmp((char *)local_58,"language");
    if ((iVar6 == 0) || (iVar6 = strcasecmp((char *)local_58,"lang"), iVar6 == 0)) {
      if (argc == 2) {
        ptVar8 = tidyLocalizedString(0x348);
        puts(ptVar8);
        iVar7 = 2;
      }
      else {
        p_Var14 = (TidyDoc)argv[2];
        tdoc_00 = p_Var14;
        iVar7 = strcasecmp((char *)p_Var14,"help");
        if (iVar7 == 0) {
          lang_help(tdoc_00);
          exit(0);
        }
        BVar3 = tidySetLanguage((ctmbstr)p_Var14);
        if (BVar3 == no) {
          ptVar8 = tidyLocalizedString(0x349);
          pcVar9 = argv[2];
          ptVar11 = tidyGetLanguage();
          printf(ptVar8,pcVar9,ptVar11);
          putchar(10);
        }
LAB_00130d98:
        argv = ppcVar15;
        iVar7 = argc + -1;
      }
      goto LAB_00130c36;
    }
    ptVar8 = "help";
    iVar6 = strcasecmp((char *)local_58,"help");
    if (iVar6 == 0) {
LAB_00130bed:
      help(local_38,ptVar8);
LAB_00130bf7:
      tidyRelease(tdoc);
      bVar2 = false;
      goto LAB_00130c41;
    }
    ptVar8 = "-help";
    iVar6 = strcasecmp((char *)local_58,"-help");
    if (iVar6 == 0) goto LAB_00130bed;
    ptVar8 = "h";
    iVar6 = strcasecmp((char *)local_58,"h");
    if ((iVar6 == 0) || ((char)local_58->_opaque == '?')) goto LAB_00130bed;
    iVar6 = strcasecmp((char *)local_58,"xml-help");
    if (iVar6 == 0) {
      xml_help();
      goto LAB_00130bf7;
    }
    p_Var14 = local_58;
    iVar6 = strcasecmp((char *)local_58,"xml-error-strings");
    if (iVar6 == 0) {
      xml_error_strings(p_Var14);
      goto LAB_00130bf7;
    }
    iVar6 = strcasecmp((char *)local_58,"xml-options-strings");
    if (iVar6 == 0) {
      xml_options_strings(tdoc);
      goto LAB_00130bf7;
    }
    iVar6 = strcasecmp((char *)local_58,"xml-strings");
    if (iVar6 == 0) {
      xml_strings();
      goto LAB_00130bf7;
    }
    iVar6 = strcasecmp((char *)local_58,"help-config");
    if (iVar6 == 0) {
      optionhelp(tdoc);
      goto LAB_00130bf7;
    }
    p_Var14 = local_58;
    iVar6 = strcasecmp((char *)local_58,"help-env");
    if (iVar6 == 0) {
      helpEnv(p_Var14);
      goto LAB_00130bf7;
    }
    iVar6 = strcasecmp((char *)local_58,"help-option");
    if (iVar6 == 0) {
      if (argc == 2) {
        ptVar8 = tidyLocalizedString(0x34a);
        puts(ptVar8);
      }
      else {
        optionDescribe(tdoc,argv[2]);
      }
      goto LAB_00130bf7;
    }
    iVar6 = strcasecmp((char *)local_58,"xml-config");
    if (iVar6 == 0) {
      XMLoptionhelp(tdoc);
      goto LAB_00130bf7;
    }
    iVar6 = strcasecmp((char *)local_58,"show-config");
    if (iVar6 == 0) {
      optionvalues(tdoc);
      goto LAB_00130bf7;
    }
    iVar6 = strcasecmp((char *)local_58,"export-config");
    if (iVar6 == 0) {
LAB_00131197:
      ForEachSortedOption(tdoc,printOptionExportValues);
      goto LAB_00130bf7;
    }
    iVar6 = strcasecmp((char *)local_58,"export-default-config");
    if (iVar6 == 0) {
      tidyOptResetAllToDefault(tdoc);
      goto LAB_00131197;
    }
    iVar6 = strcasecmp((char *)local_58,"config");
    if (iVar6 == 0) {
      iVar7 = 2;
      if (argc != 2) {
        tidyLoadConfig(tdoc,argv[2]);
LAB_001311eb:
        ptVar8 = tidyOptGetValue(tdoc,TidyErrFile);
        if ((ptVar8 != (ctmbstr)0x0) &&
           ((local_48 == (char *)0x0 || (iVar7 = strcmp(local_48,ptVar8), iVar7 != 0)))) {
          errout = tidySetErrorFile(tdoc,ptVar8);
          local_48 = ptVar8;
        }
        goto LAB_00130d98;
      }
    }
    else {
      iVar6 = strcasecmp((char *)local_58,"output");
      if (((iVar6 == 0) || (iVar6 = strcasecmp((char *)local_58,"-output-file"), iVar6 == 0)) ||
         (iVar6 = strcasecmp((char *)local_58,"o"), iVar6 == 0)) {
        iVar7 = 2;
        if (argc != 2) {
          tidyOptSetValue(tdoc,TidyOutFile,argv[2]);
          goto LAB_00130d98;
        }
      }
      else {
        iVar6 = strcasecmp((char *)local_58,"file");
        if (((iVar6 == 0) || (iVar6 = strcasecmp((char *)local_58,"-file"), iVar6 == 0)) ||
           (iVar6 = strcasecmp((char *)local_58,"f"), iVar6 == 0)) {
          iVar7 = 2;
          if (argc != 2) {
            local_48 = argv[2];
            errout = tidySetErrorFile(tdoc,local_48);
            argv = ppcVar15;
            iVar7 = argc + -1;
          }
        }
        else {
          iVar6 = strcasecmp((char *)local_58,"wrap");
          if (((iVar6 == 0) || (iVar6 = strcasecmp((char *)local_58,"-wrap"), iVar6 == 0)) ||
             (iVar6 = strcasecmp((char *)local_58,"w"), iVar6 == 0)) {
            iVar7 = 2;
            if (argc != 2) {
              local_3c = 0;
              iVar7 = __isoc99_sscanf(argv[2],"%u",&local_3c);
              TVar13 = TidyWrapLen;
              uVar4 = local_3c;
LAB_001312b6:
              tidyOptSetInt(tdoc,TVar13,(ulong)uVar4);
              if (0 < iVar7) {
                argv = ppcVar15;
              }
              iVar7 = argc - (uint)(0 < iVar7);
            }
          }
          else {
            p_Var14 = local_58;
            iVar6 = strcasecmp((char *)local_58,"version");
            if (((iVar6 == 0) ||
                (p_Var14 = local_58, iVar6 = strcasecmp((char *)local_58,"-version"), iVar6 == 0))
               || (p_Var14 = local_58, iVar6 = strcasecmp((char *)local_58,"v"), iVar6 == 0)) {
              version(p_Var14);
              goto LAB_00130bf7;
            }
            iVar6 = strncmp(pcVar9,"--",2);
            if (iVar6 == 0) {
              BVar3 = tidyOptParseValue(tdoc,pcVar9 + 2,argv[2]);
              if (BVar3 != no) goto LAB_001311eb;
            }
            else {
              pcVar9 = "access";
              iVar6 = strcasecmp((char *)local_58,"access");
              if (iVar6 != 0) {
                do {
                  cVar1 = (char)local_58->_opaque;
                  switch(cVar1) {
                  case 'b':
                    pcVar9 = (char *)0x2f;
                    break;
                  case 'c':
                    pcVar9 = (char *)0x30;
                    break;
                  case 'd':
                  case 'f':
                  case 'h':
                  case 'j':
                  case 'k':
                  case 'l':
                  case 'o':
                  case 'p':
                  case 'r':
                  case 's':
                  case 't':
                    goto switchD_0013105a_caseD_64;
                  case 'e':
                    pcVar9 = (char *)0x4c;
                    BVar3 = no;
                    goto LAB_001310e4;
                  case 'g':
                    pcVar9 = (char *)0x1f;
                    break;
                  case 'i':
                    tidyOptSetInt(tdoc,TidyIndentContent,2);
                    pcVar9 = (char *)0x26;
                    uVar10 = tidyOptGetInt(tdoc,TidyIndentSpaces);
                    if (uVar10 == 0) {
                      pcVar9 = (char *)0x26;
                      tidyOptResetToDefault(tdoc,TidyIndentSpaces);
                    }
                    goto LAB_001310e9;
                  case 'm':
                    pcVar9 = (char *)0x61;
                    break;
                  case 'n':
                    pcVar9 = (char *)0x3a;
                    break;
                  case 'q':
                    pcVar9 = (char *)0x44;
                    break;
                  case 'u':
                    pcVar9 = (char *)0x55;
                    break;
                  default:
                    if (cVar1 != '\0') {
switchD_0013105a_caseD_64:
                      unknownOption((TidyDoc)(ulong)(uint)(int)cVar1,(uint)pcVar9);
                      goto LAB_001310e9;
                    }
                    goto LAB_00130c36;
                  }
                  BVar3 = yes;
LAB_001310e4:
                  tidyOptSetBool(tdoc,(TidyOptionId)pcVar9,BVar3);
LAB_001310e9:
                  local_58 = (TidyDoc)((long)&local_58->_opaque + 1);
                } while( true );
              }
              iVar7 = 2;
              if (argc != 2) {
                local_40 = 0;
                iVar7 = __isoc99_sscanf(argv[2],"%u",&local_40);
                TVar13 = TidyAccessibilityCheckLevel;
                uVar4 = local_40;
                goto LAB_001312b6;
              }
            }
          }
        }
      }
    }
  }
LAB_00130c36:
  argc = iVar7 + -1;
  argv = argv + 1;
  bVar2 = true;
LAB_00130c41:
  if (!bVar2) {
    return 0;
  }
  goto LAB_00130715;
}

Assistant:

int main( int argc, char** argv )
{
    ctmbstr prog = argv[0];
    ctmbstr cfgfil = NULL, errfil = NULL, htmlfil = NULL;
    TidyDoc tdoc = NULL;
    int status = 0;

    uint contentErrors = 0;
    uint contentWarnings = 0;
    uint accessWarnings = 0;

#if defined(ENABLE_DEBUG_LOG) && defined(_MSC_VER)
#  if defined(_CRTDBG_MAP_ALLOC)
    _CrtSetDbgFlag(_CRTDBG_ALLOC_MEM_DF | _CRTDBG_LEAK_CHECK_DF);
#  endif
#endif

    tdoc = tidyCreate();

    tidySetMessageCallback( tdoc, reportCallback); /* experimental group */
    errout = stderr;  /* initialize to stderr */

    /* Set an atexit handler. */
    atexit( tidy_cleanup );

#if defined(_WIN32)
    /* Force Windows console to use UTF, otherwise many characters will
     * be garbage. Note that East Asian languages *are* supported, but
     * only when Windows OS locale (not console only!) is set to an
     * East Asian language.
     */
    win_cp = GetConsoleOutputCP();
    SetConsoleOutputCP(CP_UTF8);
#endif

    /*
     * Look for default configuration files using any of
     * the following possibilities:
     *  - TIDY_CONFIG_FILE - from tidyplatform.h, typically /etc/tidy.conf
     *  - HTML_TIDY        - environment variable
     *  - TIDY_USER_CONFIG_FILE - from tidyplatform.h, typically ~/tidy.conf
     */

#ifdef TIDY_CONFIG_FILE
    if ( tidyFileExists( tdoc, TIDY_CONFIG_FILE) )
    {
        status = tidyLoadConfig( tdoc, TIDY_CONFIG_FILE );
        if ( status != 0 ) {
            fprintf(errout, tidyLocalizedString( TC_MAIN_ERROR_LOAD_CONFIG ), TIDY_CONFIG_FILE, status);
            fprintf(errout, "\n");
        }
    }
#endif /* TIDY_CONFIG_FILE */

    if ( (cfgfil = getenv("HTML_TIDY")) != NULL )
    {
        status = tidyLoadConfig( tdoc, cfgfil );
        if ( status != 0 ) {
            fprintf(errout, tidyLocalizedString( TC_MAIN_ERROR_LOAD_CONFIG ), cfgfil, status);
            fprintf(errout, "\n");
        }
    }
#ifdef TIDY_USER_CONFIG_FILE
    else if ( tidyFileExists( tdoc, TIDY_USER_CONFIG_FILE) )
    {
        status = tidyLoadConfig( tdoc, TIDY_USER_CONFIG_FILE );
        if ( status != 0 ) {
            fprintf(errout, tidyLocalizedString( TC_MAIN_ERROR_LOAD_CONFIG ), TIDY_USER_CONFIG_FILE, status);
            fprintf(errout, "\n");
        }
    }
#endif /* TIDY_USER_CONFIG_FILE */


    /*
     * Read command line
     */

    while ( argc > 0 )
    {
        if (argc > 1 && argv[1][0] == '-')
        {
            /* support -foo and --foo */
            ctmbstr arg = argv[1] + 1;

            if ( strcasecmp(arg, "xml") == 0)
                tidyOptSetBool( tdoc, TidyXmlTags, yes );

            else if ( strcasecmp(arg,   "asxml") == 0 ||
                     strcasecmp(arg, "asxhtml") == 0 )
            {
                tidyOptSetBool( tdoc, TidyXhtmlOut, yes );
            }
            else if ( strcasecmp(arg,   "ashtml") == 0 )
                tidyOptSetBool( tdoc, TidyHtmlOut, yes );

            else if ( strcasecmp(arg, "indent") == 0 )
            {
                tidyOptSetInt( tdoc, TidyIndentContent, TidyAutoState );
                if ( tidyOptGetInt(tdoc, TidyIndentSpaces) == 0 )
                    tidyOptResetToDefault( tdoc, TidyIndentSpaces );
            }
            else if ( strcasecmp(arg, "omit") == 0 )
                tidyOptSetBool( tdoc, TidyOmitOptionalTags, yes );

            else if ( strcasecmp(arg, "upper") == 0 )
                tidyOptSetBool( tdoc, TidyUpperCaseTags, yes );

            else if ( strcasecmp(arg, "clean") == 0 )
                tidyOptSetBool( tdoc, TidyMakeClean, yes );

            else if ( strcasecmp(arg, "gdoc") == 0 )
                tidyOptSetBool( tdoc, TidyGDocClean, yes );

            else if ( strcasecmp(arg, "bare") == 0 )
                tidyOptSetBool( tdoc, TidyMakeBare, yes );

            else if ( strcasecmp(arg, "raw") == 0     ||
                     strcasecmp(arg, "ascii") == 0    ||
                     strcasecmp(arg, "latin0") == 0   ||
                     strcasecmp(arg, "latin1") == 0   ||
                     strcasecmp(arg, "utf8") == 0     ||
#ifndef NO_NATIVE_ISO2022_SUPPORT
                     strcasecmp(arg, "iso2022") == 0  ||
#endif
                     strcasecmp(arg, "utf16le") == 0  ||
                     strcasecmp(arg, "utf16be") == 0  ||
                     strcasecmp(arg, "utf16") == 0    ||
                     strcasecmp(arg, "shiftjis") == 0 ||
                     strcasecmp(arg, "big5") == 0     ||
                     strcasecmp(arg, "mac") == 0      ||
                     strcasecmp(arg, "win1252") == 0  ||
                     strcasecmp(arg, "ibm858") == 0 )
            {
                tidySetCharEncoding( tdoc, arg );
            }
            else if ( strcasecmp(arg, "numeric") == 0 )
                tidyOptSetBool( tdoc, TidyNumEntities, yes );

            else if ( strcasecmp(arg, "modify") == 0 ||
                     strcasecmp(arg, "change") == 0 ||  /* obsolete */
                     strcasecmp(arg, "update") == 0 )   /* obsolete */
            {
                tidyOptSetBool( tdoc, TidyWriteBack, yes );
            }
            else if ( strcasecmp(arg, "errors") == 0 )
                tidyOptSetBool( tdoc, TidyShowMarkup, no );

            else if ( strcasecmp(arg, "quiet") == 0 )
                tidyOptSetBool( tdoc, TidyQuiet, yes );

            /* Currenly user must specify a language
             prior to anything that causes output */
            else if ( strcasecmp(arg, "language") == 0 ||
                     strcasecmp(arg,     "lang") == 0 )
                if ( argc >= 3)
                {
                    if ( strcasecmp(argv[2], "help") == 0 )
                    {
                        lang_help( tdoc );
                        exit(0);
                    }
                    if ( !tidySetLanguage( argv[2] ) )
                    {
                        printf(tidyLocalizedString(TC_STRING_LANG_NOT_FOUND),
                               argv[2], tidyGetLanguage());
                        printf("\n");
                    }
                    --argc;
                    ++argv;
                }
                else
                {
                    printf( "%s\n", tidyLocalizedString(TC_STRING_LANG_MUST_SPECIFY));
                }

            else if ( strcasecmp(arg, "help") == 0 ||
                        strcasecmp(arg, "-help") == 0 ||
                        strcasecmp(arg,    "h") == 0 || *arg == '?' )
            {
                help( tdoc, prog );
                tidyRelease( tdoc );
                return 0; /* success */
            }
            else if ( strcasecmp(arg, "xml-help") == 0)
            {
                xml_help( );
                tidyRelease( tdoc );
                return 0; /* success */
            }
            else if ( strcasecmp(arg, "xml-error-strings") == 0)
            {
                xml_error_strings( tdoc );
                tidyRelease( tdoc );
                return 0; /* success */
            }
            else if ( strcasecmp(arg, "xml-options-strings") == 0)
            {
                xml_options_strings( tdoc );
                tidyRelease( tdoc );
                return 0; /* success */
            }
            else if ( strcasecmp(arg, "xml-strings") == 0)
            {
                xml_strings( );
                tidyRelease( tdoc );
                return 0; /* success */
            }
            else if ( strcasecmp(arg, "help-config") == 0 )
            {
                optionhelp( tdoc );
                tidyRelease( tdoc );
                return 0; /* success */
            }
            else if ( strcasecmp(arg, "help-env") == 0 )
            {
                helpEnv( tdoc );
                tidyRelease( tdoc );
                return 0; /* success */
            }
            else if ( strcasecmp(arg, "help-option") == 0 )
            {
                if ( argc >= 3)
                {
                    optionDescribe( tdoc, argv[2] );
                }
                else
                {
                    printf( "%s\n", tidyLocalizedString(TC_STRING_MUST_SPECIFY));
                }
                tidyRelease( tdoc );
                return 0; /* success */
            }
            else if ( strcasecmp(arg, "xml-config") == 0 )
            {
                XMLoptionhelp( tdoc );
                tidyRelease( tdoc );
                return 0; /* success */
            }
            else if ( strcasecmp(arg, "show-config") == 0 )
            {
                optionvalues( tdoc );
                tidyRelease( tdoc );
                return 0; /* success */
            }
            else if ( strcasecmp(arg, "export-config") == 0 )
            {
                exportOptionValues( tdoc );
                tidyRelease( tdoc );
                return 0; /* success */
            }
            else if ( strcasecmp(arg, "export-default-config") == 0 )
            {
                exportDefaultOptionValues( tdoc );
                tidyRelease( tdoc );
                return 0; /* success */
            }
            else if ( strcasecmp(arg, "config") == 0 )
            {
                if ( argc >= 3 )
                {
                    ctmbstr post;

                    tidyLoadConfig( tdoc, argv[2] );

                    /* Set new error output stream if setting changed */
                    post = tidyOptGetValue( tdoc, TidyErrFile );
                    if ( post && (!errfil || !samefile(errfil, post)) )
                    {
                        errfil = post;
                        errout = tidySetErrorFile( tdoc, post );
                    }

                    --argc;
                    ++argv;
                }
            }

            else if ( strcasecmp(arg, "output") == 0 ||
                        strcasecmp(arg, "-output-file") == 0 ||
                        strcasecmp(arg, "o") == 0 )
            {
                if ( argc >= 3 )
                {
                    tidyOptSetValue( tdoc, TidyOutFile, argv[2] );
                    --argc;
                    ++argv;
                }
            }
            else if ( strcasecmp(arg,  "file") == 0 ||
                        strcasecmp(arg, "-file") == 0 ||
                        strcasecmp(arg,     "f") == 0 )
            {
                if ( argc >= 3 )
                {
                    errfil = argv[2];
                    errout = tidySetErrorFile( tdoc, errfil );
                    --argc;
                    ++argv;
                }
            }
            else if ( strcasecmp(arg,  "wrap") == 0 ||
                        strcasecmp(arg, "-wrap") == 0 ||
                        strcasecmp(arg,     "w") == 0 )
            {
                if ( argc >= 3 )
                {
                    uint wraplen = 0;
                    int nfields = sscanf( argv[2], "%u", &wraplen );
                    tidyOptSetInt( tdoc, TidyWrapLen, wraplen );
                    if (nfields > 0)
                    {
                        --argc;
                        ++argv;
                    }
                }
            }
            else if ( strcasecmp(arg,  "version") == 0 ||
                        strcasecmp(arg, "-version") == 0 ||
                        strcasecmp(arg,        "v") == 0 )
            {
                version( tdoc );
                tidyRelease( tdoc );
                return 0;  /* success */

            }
            else if ( strncmp(argv[1], "--", 2 ) == 0)
            {
                if ( tidyOptParseValue(tdoc, argv[1]+2, argv[2]) )
                {
                    /* Set new error output stream if setting changed */
                    ctmbstr post = tidyOptGetValue( tdoc, TidyErrFile );
                    if ( post && (!errfil || !samefile(errfil, post)) )
                    {
                        errfil = post;
                        errout = tidySetErrorFile( tdoc, post );
                    }

                    ++argv;
                    --argc;
                }
            }
                else if ( strcasecmp(arg, "access") == 0 )
                {
                    if ( argc >= 3 )
                    {
                        uint acclvl = 0;
                        int nfields = sscanf( argv[2], "%u", &acclvl );
                        tidyOptSetInt( tdoc, TidyAccessibilityCheckLevel, acclvl );
                        if (nfields > 0)
                        {
                            --argc;
                            ++argv;
                        }
                    }
                }

                else
                {
                    uint c;
                    ctmbstr s = argv[1];

                    while ( (c = *++s) != '\0' )
                    {
                        switch ( c )
                        {
                            case 'i':
                                tidyOptSetInt( tdoc, TidyIndentContent, TidyAutoState );
                                if ( tidyOptGetInt(tdoc, TidyIndentSpaces) == 0 )
                                    tidyOptResetToDefault( tdoc, TidyIndentSpaces );
                                break;

                            case 'u':
                                tidyOptSetBool( tdoc, TidyUpperCaseTags, yes );
                                break;

                            case 'c':
                                tidyOptSetBool( tdoc, TidyMakeClean, yes );
                                break;

                            case 'g':
                                tidyOptSetBool( tdoc, TidyGDocClean, yes );
                                break;

                            case 'b':
                                tidyOptSetBool( tdoc, TidyMakeBare, yes );
                                break;

                            case 'n':
                                tidyOptSetBool( tdoc, TidyNumEntities, yes );
                                break;

                            case 'm':
                                tidyOptSetBool( tdoc, TidyWriteBack, yes );
                                break;

                            case 'e':
                                tidyOptSetBool( tdoc, TidyShowMarkup, no );
                                break;

                            case 'q':
                                tidyOptSetBool( tdoc, TidyQuiet, yes );
                                break;

                            default:
                                unknownOption( tdoc, c );
                                break;
                        }
                    }
                }

            --argc;
            ++argv;
            continue;
        }


        if ( argc > 1 )
        {
            htmlfil = argv[1];
#ifdef ENABLE_DEBUG_LOG
            SPRTF("Tidy: '%s'\n", htmlfil);
#else /* !ENABLE_DEBUG_LOG */
            /* Is #713 - show-filename option */
            if (tidyOptGetBool(tdoc, TidyShowFilename))
            {
                fprintf(errout, "Tidy: '%s'", htmlfil);
                fprintf(errout, "\n");
            }
#endif /* ENABLE_DEBUG_LOG yes/no */
            if ( tidyOptGetBool(tdoc, TidyEmacs) || tidyOptGetBool(tdoc, TidyShowFilename))
                tidySetEmacsFile( tdoc, htmlfil );
            status = tidyParseFile( tdoc, htmlfil );
        }
        else
        {
            htmlfil = "stdin";
            status = tidyParseStdin( tdoc );
        }

        if ( status >= 0 )
            status = tidyCleanAndRepair( tdoc );

        if ( status >= 0 ) {
            status = tidyRunDiagnostics( tdoc );
        }
        if ( status > 1 ) /* If errors, do we want to force output? */
            status = ( tidyOptGetBool(tdoc, TidyForceOutput) ? status : -1 );

        if ( status >= 0 && tidyOptGetBool(tdoc, TidyShowMarkup) )
        {
            if ( tidyOptGetBool(tdoc, TidyWriteBack) && argc > 1 )
                status = tidySaveFile( tdoc, htmlfil );
            else
            {
                ctmbstr outfil = tidyOptGetValue( tdoc, TidyOutFile );
                if ( outfil ) {
                    status = tidySaveFile( tdoc, outfil );
                } else {
#ifdef ENABLE_DEBUG_LOG
                    static char tmp_buf[264];
                    sprintf(tmp_buf,"%s.html",get_log_file());
                    status = tidySaveFile( tdoc, tmp_buf );
                    SPRTF("Saved tidied content to '%s'\n",tmp_buf);
#else
                    status = tidySaveStdout( tdoc );
#endif
                }
            }
        }
        
        contentErrors   += tidyErrorCount( tdoc );
        contentWarnings += tidyWarningCount( tdoc );
        accessWarnings  += tidyAccessWarningCount( tdoc );
        
        --argc;
        ++argv;
        
        if ( argc <= 1 )
            break;
    } /* read command line loop */

    /* blank line for screen formatting */
    if ( errout == stderr && !contentErrors && !tidyOptGetBool( tdoc, TidyQuiet ) )
        fprintf(errout, "\n");

    /* footnote printing only if errors or warnings */
    if ( contentErrors + contentWarnings > 0 )
        tidyErrorSummary(tdoc);

    /* prints the general info, if applicable */
    tidyGeneralInfo(tdoc);

    /* called to free hash tables etc. */
    tidyRelease( tdoc );
    
    /* return status can be used by scripts */
    if ( contentErrors > 0 )
        return 2;
    
    if ( contentWarnings > 0 )
        return 1;
    
    /* 0 signifies all is ok */
    return 0;
}